

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dequantize.cpp
# Opt level: O1

int __thiscall
ncnn::Dequantize::forward(Dequantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  float *pfVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  int iVar14;
  void *pvVar15;
  void *pvVar16;
  long lVar17;
  float *pfVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  float fVar22;
  
  iVar2 = bottom_blob->dims;
  iVar3 = bottom_blob->w;
  uVar4 = bottom_blob->h;
  uVar5 = bottom_blob->c;
  Mat::create_like(top_blob,bottom_blob,opt->blob_allocator);
  pvVar15 = top_blob->data;
  iVar14 = -100;
  if ((pvVar15 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    iVar14 = 0;
    if (iVar2 == 3) {
      if (0 < (int)uVar5) {
        pvVar15 = bottom_blob->data;
        sVar9 = bottom_blob->cstep;
        pvVar16 = top_blob->data;
        sVar11 = top_blob->cstep;
        iVar2 = this->scale_data_size;
        iVar14 = this->bias_data_size;
        uVar19 = 1;
        if (1 < (int)uVar5) {
          uVar19 = (ulong)uVar5;
        }
        sVar12 = bottom_blob->elemsize;
        pfVar10 = (float *)(this->bias_data).data;
        sVar13 = top_blob->elemsize;
        uVar20 = 0;
        do {
          uVar21 = 0;
          if (iVar2 != 1) {
            uVar21 = uVar20 & 0xffffffff;
          }
          if (iVar14 == 0) {
            fVar22 = 0.0;
          }
          else {
            pfVar18 = pfVar10;
            if (iVar14 != 1) {
              pfVar18 = pfVar10 + uVar20;
            }
            fVar22 = *pfVar18;
          }
          if (0 < (int)(uVar4 * iVar3)) {
            fVar1 = *(float *)((long)(this->scale_data).data + uVar21 * 4);
            lVar17 = 0;
            do {
              *(float *)((long)pvVar16 + lVar17 * 4) =
                   (float)*(int *)((long)pvVar15 + lVar17 * 4) * fVar1 + fVar22;
              lVar17 = lVar17 + 1;
            } while (uVar4 * iVar3 != (int)lVar17);
          }
          uVar20 = uVar20 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar9 * sVar12);
          pvVar16 = (void *)((long)pvVar16 + sVar11 * sVar13);
        } while (uVar20 != uVar19);
        iVar14 = 0;
      }
    }
    else if (iVar2 == 2) {
      if (0 < (int)uVar4) {
        pvVar16 = bottom_blob->data;
        iVar2 = bottom_blob->w;
        iVar6 = top_blob->w;
        iVar7 = this->scale_data_size;
        iVar8 = this->bias_data_size;
        sVar9 = bottom_blob->elemsize;
        pfVar10 = (float *)(this->bias_data).data;
        sVar11 = top_blob->elemsize;
        uVar19 = 0;
        do {
          uVar20 = 0;
          if (iVar7 != 1) {
            uVar20 = uVar19 & 0xffffffff;
          }
          if (iVar8 == 0) {
            fVar22 = 0.0;
          }
          else {
            pfVar18 = pfVar10;
            if (iVar8 != 1) {
              pfVar18 = pfVar10 + uVar19;
            }
            fVar22 = *pfVar18;
          }
          if (0 < iVar3) {
            fVar1 = *(float *)((long)(this->scale_data).data + uVar20 * 4);
            lVar17 = 0;
            do {
              *(float *)((long)pvVar15 + lVar17 * 4) =
                   (float)*(int *)((long)pvVar16 + lVar17 * 4) * fVar1 + fVar22;
              lVar17 = lVar17 + 1;
            } while (iVar3 != (int)lVar17);
          }
          uVar19 = uVar19 + 1;
          pvVar16 = (void *)((long)pvVar16 + (long)iVar2 * sVar9);
          pvVar15 = (void *)((long)pvVar15 + (long)iVar6 * sVar11);
        } while (uVar19 != uVar4);
      }
    }
    else {
      iVar14 = 0;
      if (iVar2 == 1) {
        if (this->bias_data_size == 0) {
          fVar22 = 0.0;
        }
        else {
          fVar22 = *(this->bias_data).data;
        }
        iVar14 = 0;
        if (0 < iVar3) {
          pvVar16 = bottom_blob->data;
          fVar1 = *(this->scale_data).data;
          lVar17 = 0;
          do {
            *(float *)((long)pvVar15 + lVar17 * 4) =
                 (float)*(int *)((long)pvVar16 + lVar17 * 4) * fVar1 + fVar22;
            lVar17 = lVar17 + 1;
          } while (iVar3 != (int)lVar17);
        }
      }
    }
  }
  return iVar14;
}

Assistant:

int Dequantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int dims = bottom_blob.dims;
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int channels = bottom_blob.c;

    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (dims == 1)
    {
        // assert scale_data_size == 1
        // assert bias_data_size == 0 || bias_data_size == 1

        const int* intptr = bottom_blob;
        float* ptr = top_blob;

        const float scale = scale_data[0];
        const float bias = bias_data_size == 0 ? 0.f : bias_data[0];

        dequantize(intptr, ptr, scale, bias, w);
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            const int* intptr = bottom_blob.row<const int>(i);
            float* ptr = top_blob.row(i);

            const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[i];
            const float bias = bias_data_size == 0 ? 0.f : bias_data_size == 1 ? bias_data[0] : bias_data[i];

            dequantize(intptr, ptr, scale, bias, w);
        }
    }

    if (dims == 3)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const int* intptr = bottom_blob.channel(q);
            float* ptr = top_blob.channel(q);

            const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[q];
            const float bias = bias_data_size == 0 ? 0.f : bias_data_size == 1 ? bias_data[0] : bias_data[q];

            dequantize(intptr, ptr, scale, bias, w * h);
        }
    }

    return 0;
}